

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint.cpp
# Opt level: O2

void QMutableEventPoint::detach(QEventPoint *p)

{
  QEventPointPrivate *ptr;
  
  if ((p->d).d.ptr != (QEventPointPrivate *)0x0) {
    QExplicitlySharedDataPointer<QEventPointPrivate>::detach(&p->d);
    return;
  }
  ptr = (QEventPointPrivate *)operator_new(0xe0);
  (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  memset(&ptr->device,0,0x88);
  ptr->pressure = 1.0;
  ptr->rotation = 0.0;
  (ptr->ellipseDiameters).wd = 0.0;
  (ptr->ellipseDiameters).ht = 0.0;
  *(undefined8 *)(ptr->velocity).v = 0;
  ptr->pressTimestamp = 0;
  ptr->timestamp = 0;
  ptr->lastTimestamp = 0;
  (ptr->uniqueId).m_numericId = -1;
  ptr->pointId = -1;
  ptr->state = Unknown;
  ptr->accept = false;
  QExplicitlySharedDataPointer<QEventPointPrivate>::reset(&p->d,ptr);
  return;
}

Assistant:

void QMutableEventPoint::detach(QEventPoint &p)
{
    if (p.d)
        p.d.detach();
    else
        p.d.reset(new QEventPointPrivate(-1, nullptr));
}